

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chaiscript_common.hpp
# Opt level: O2

string * __thiscall
chaiscript::AST_Node_Trace::pretty_print_abi_cxx11_
          (string *__return_storage_ptr__,AST_Node_Trace *this)

{
  pointer pAVar1;
  ostream *poVar2;
  pointer this_00;
  string sStack_1c8;
  ostringstream oss;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
  std::operator<<((ostream *)&oss,(string *)&this->text);
  pAVar1 = (this->children).
           super__Vector_base<chaiscript::AST_Node_Trace,_std::allocator<chaiscript::AST_Node_Trace>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (this_00 = (this->children).
                 super__Vector_base<chaiscript::AST_Node_Trace,_std::allocator<chaiscript::AST_Node_Trace>_>
                 ._M_impl.super__Vector_impl_data._M_start; this_00 != pAVar1; this_00 = this_00 + 1
      ) {
    pretty_print_abi_cxx11_(&sStack_1c8,this_00);
    poVar2 = std::operator<<((ostream *)&oss,(string *)&sStack_1c8);
    std::operator<<(poVar2,' ');
    std::__cxx11::string::~string((string *)&sStack_1c8);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&oss);
  return __return_storage_ptr__;
}

Assistant:

std::string pretty_print() const {
      std::ostringstream oss;

      oss << text;

      for (const auto &elem : children) {
        oss << elem.pretty_print() << ' ';
      }

      return oss.str();
    }